

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_>::TPZFrontMatrix
          (TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontSym<double>_> *this)

{
  TPZAbstractFrontMatrix<double>::TPZAbstractFrontMatrix
            (&this->super_TPZAbstractFrontMatrix<double>,&PTR_PTR_017b63b8);
  (this->super_TPZAbstractFrontMatrix<double>).super_TPZMatrix<double>.super_TPZBaseMatrix.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFrontMatrix_017b6130;
  TPZFileEqnStorage<double>::TPZFileEqnStorage(&this->fStorage);
  TPZFrontSym<double>::TPZFrontSym(&this->fFront);
  (this->fNumElConnected)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fNumElConnected).fNAlloc = 0;
  (this->fNumElConnected).fStore = (int *)0x0;
  (this->fNumElConnected).fNElements = 0;
  (this->fNumElConnectedBackup)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649228;
  (this->fNumElConnectedBackup).fStore = (int *)0x0;
  (this->fNumElConnectedBackup).fNElements = 0;
  (this->fNumElConnectedBackup).fNAlloc = 0;
  TPZFrontSym<double>::Reset(&this->fFront,0);
  TPZFileEqnStorage<double>::Reset(&this->fStorage);
  TPZVec<int>::Resize(&this->fNumElConnected,0);
  TPZVec<int>::Resize(&this->fNumElConnectedBackup,0);
  this->fLastDecomposed = -1;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZFrontMatrix<TVar,store, front>::TPZFrontMatrix() : TPZRegisterClassId(&TPZFrontMatrix::ClassId),
TPZAbstractFrontMatrix<TVar>()
{
	fFront.Reset();
	fStorage.Reset();
	fNumElConnected.Resize(0);
	fNumElConnectedBackup.Resize(0);
	fLastDecomposed = -1;
	fNumEq=0;
}